

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepTiledInputFile::multiPartInitialize(DeepTiledInputFile *this,InputPartData *part)

{
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  undefined4 extraout_var;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  psVar4 = Header::type_abi_cxx11_(&part->header);
  bVar2 = isTiled(psVar4);
  if (bVar2) {
    pDVar1 = this->_data;
    pDVar1->_streamData = part->mutex;
    Header::operator=(&pDVar1->header,&part->header);
    pDVar1 = this->_data;
    pDVar1->version = part->version;
    pDVar1->partNumber = part->partNumber;
    iVar3 = (*pDVar1->_streamData->is->_vptr_IStream[2])();
    this->_data->memoryMapped = SUB41(iVar3,0);
    initialize(this);
    pDVar1 = this->_data;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_1c0,&part->chunkOffsets);
    TileOffsets::readFrom(&pDVar1->tileOffsets,&local_1c0,&this->_data->fileIsComplete);
    if (local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar3 = (*this->_data->_streamData->is->_vptr_IStream[5])();
    this->_data->_streamData->currentPosition = CONCAT44(extraout_var,iVar3);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Can\'t build a DeepTiledInputFile from a part of type ",0x35);
  psVar4 = Header::type_abi_cxx11_(&part->header);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,local_1a8);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledInputFile::multiPartInitialize(InputPartData* part)
{
    if (isTiled(part->header.type()) == false)
        THROW (IEX_NAMESPACE::ArgExc, "Can't build a DeepTiledInputFile from a part of type " << part->header.type());

    _data->_streamData = part->mutex;
    _data->header = part->header;
    _data->version = part->version;
    _data->partNumber = part->partNumber;
    _data->memoryMapped = _data->_streamData->is->isMemoryMapped();
    initialize();
    _data->tileOffsets.readFrom(part->chunkOffsets , _data->fileIsComplete);
    _data->_streamData->currentPosition = _data->_streamData->is->tellg();
}